

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O3

UBool generateFromUTable(CnvExtData *extData,UCMTable *table,int32_t start,int32_t limit,
                        int32_t unitIndex,uint32_t defaultValue)

{
  ushort uVar1;
  int iVar2;
  UCMapping *pUVar3;
  int32_t *piVar4;
  UBool UVar5;
  uint32_t defaultValue_00;
  uint32_t uVar6;
  UCMapping *pUVar7;
  undefined2 *puVar8;
  uint32_t *puVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint32_t start_00;
  uint uVar18;
  uint32_t limit_00;
  long lVar19;
  bool bVar20;
  
  pUVar3 = table->mappings;
  piVar4 = table->reverseMap;
  lVar11 = (long)start;
  pUVar7 = pUVar3 + piVar4[lVar11];
  if (pUVar7->uLen != '\x01') {
    pUVar7 = (UCMapping *)(table->codePoints + pUVar7->u);
  }
  lVar19 = (long)unitIndex;
  uVar17 = (uint)*(ushort *)((long)&pUVar7->u + lVar19 * 2);
  uVar18 = 1;
  if (start + 1 < limit) {
    uVar18 = 1;
    lVar15 = 0;
    uVar12 = uVar17;
    do {
      pUVar7 = pUVar3 + piVar4[(start + 1) + lVar15];
      if (pUVar7->uLen != '\x01') {
        pUVar7 = (UCMapping *)(table->codePoints + pUVar7->u);
      }
      uVar13 = (uint)*(ushort *)((long)&pUVar7->u + lVar19 * 2);
      uVar18 = uVar18 + (uVar12 != uVar13);
      lVar15 = lVar15 + 1;
      uVar12 = uVar13;
    } while (~start + limit != (int)lVar15);
  }
  puVar8 = (undefined2 *)utm_allocN(extData->fromUTableUChars,uVar18 + 1);
  puVar9 = (uint32_t *)utm_allocN(extData->fromUTableValues,uVar18 + 1);
  *puVar8 = (short)uVar18;
  *puVar9 = defaultValue;
  if (start < limit) {
    uVar17 = uVar17 - 1;
    lVar15 = 0;
    iVar14 = 0;
    do {
      pUVar7 = pUVar3 + piVar4[lVar11 + lVar15];
      if (pUVar7->uLen != '\x01') {
        pUVar7 = (UCMapping *)(table->codePoints + pUVar7->u);
      }
      uVar1 = *(ushort *)((long)&pUVar7->u + lVar19 * 2);
      if (uVar17 != uVar1) {
        puVar8[(long)iVar14 + 1] = uVar1;
        puVar9[(long)iVar14 + 1] = start + (int)lVar15;
        iVar14 = iVar14 + 1;
        uVar17 = (uint)uVar1;
      }
      lVar15 = lVar15 + 1;
    } while (limit - lVar11 != lVar15);
  }
  iVar14 = unitIndex + 1;
  uVar10 = 1;
  if (1 < (int)uVar18) {
    uVar10 = (ulong)uVar18;
  }
  uVar16 = 1;
  start_00 = puVar9[1];
  do {
    limit_00 = limit;
    if ((long)uVar16 < (long)(int)uVar18) {
      limit_00 = puVar9[uVar16 + 1];
    }
    iVar2 = piVar4[(int)start_00];
    defaultValue_00 = 0;
    if (iVar14 == pUVar3[iVar2].uLen) {
      start_00 = start_00 + 1;
      if (((int)start_00 < (int)limit_00) && (iVar14 == pUVar3[piVar4[(int)start_00]].uLen)) {
        fwrite("error: multiple mappings from same Unicode code points\n",0x37,1,_stderr);
        ucm_printMapping(table,pUVar3 + iVar2,(FILE *)_stderr);
        ucm_printMapping(table,pUVar3 + piVar4[(int)start_00],(FILE *)_stderr);
        return '\0';
      }
      defaultValue_00 = getFromUBytesValue(extData,table,pUVar3 + iVar2);
    }
    if (start_00 == limit_00) {
      puVar9[uVar16] = defaultValue_00;
    }
    else {
      uVar6 = utm_countItems(extData->fromUTableValues);
      puVar9[uVar16] = uVar6;
      UVar5 = generateFromUTable(extData,table,start_00,limit_00,iVar14,defaultValue_00);
      if (UVar5 == '\0') {
        return '\0';
      }
    }
    bVar20 = uVar16 != uVar10;
    uVar16 = uVar16 + 1;
    start_00 = limit_00;
  } while (bVar20);
  return '\x01';
}

Assistant:

static UBool
generateFromUTable(CnvExtData *extData, UCMTable *table,
                   int32_t start, int32_t limit, int32_t unitIndex,
                   uint32_t defaultValue) {
    UCMapping *mappings, *m;
    int32_t *map;
    int32_t i, j, uniqueCount, count, subStart, subLimit;

    UChar *uchars;
    UChar32 low, high, prev;

    UChar *sectionUChars;
    uint32_t *sectionValues;

    mappings=table->mappings;
    map=table->reverseMap;

    /* step 1: examine the input units; set low, high, uniqueCount */
    m=mappings+map[start];
    uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
    low=uchars[unitIndex];
    uniqueCount=1;

    prev=high=low;
    for(i=start+1; i<limit; ++i) {
        m=mappings+map[i];
        uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
        high=uchars[unitIndex];

        if(high!=prev) {
            prev=high;
            ++uniqueCount;
        }
    }

    /* step 2: allocate the section; set count, section */
    /* the fromUTable always stores for access via binary search */
    count=uniqueCount;

    /* allocate the section: 1 entry for the header + count for the items */
    sectionUChars=(UChar *)utm_allocN(extData->fromUTableUChars, 1+count);
    sectionValues=(uint32_t *)utm_allocN(extData->fromUTableValues, 1+count);

    /* write the section header */
    *sectionUChars++=(UChar)count;
    *sectionValues++=defaultValue;

    /* step 3: write temporary section table with subsection starts */
    prev=low-1; /* just before low to prevent empty subsections before low */
    j=0; /* section table index */
    for(i=start; i<limit; ++i) {
        m=mappings+map[i];
        uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
        high=uchars[unitIndex];

        if(high!=prev) {
            /* start of a new subsection for unit high */
            prev=high;

            /* write the entry with the subsection start */
            sectionUChars[j]=(UChar)high;
            sectionValues[j]=(uint32_t)i;
            ++j;
        }
    }
    /* assert(j==count) */

    /* step 4: recurse and write results */
    subLimit=(int32_t)(sectionValues[0]);
    for(j=0; j<count; ++j) {
        subStart=subLimit;
        subLimit= (j+1)<count ? (int32_t)(sectionValues[j+1]) : limit;

        /* see if there is exactly one input unit sequence of length unitIndex+1 */
        defaultValue=0;
        m=mappings+map[subStart];
        if(m->uLen==unitIndex+1) {
            /* do not include this in generateToUTable() */
            ++subStart;

            if(subStart<subLimit && mappings[map[subStart]].uLen==unitIndex+1) {
                /* print error for multiple same-input-sequence mappings */
                fprintf(stderr, "error: multiple mappings from same Unicode code points\n");
                ucm_printMapping(table, m, stderr);
                ucm_printMapping(table, mappings+map[subStart], stderr);
                return FALSE;
            }

            defaultValue=getFromUBytesValue(extData, table, m);
        }

        if(subStart==subLimit) {
            /* write the result for the input sequence ending here */
            sectionValues[j]=defaultValue;
        } else {
            /* write the index to the subsection table */
            sectionValues[j]=(uint32_t)utm_countItems(extData->fromUTableValues);

            /* recurse */
            if(!generateFromUTable(extData, table, subStart, subLimit, unitIndex+1, defaultValue)) {
                return FALSE;
            }
        }
    }
    return TRUE;
}